

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

bool DivisionCornerCaseHelper<int,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long lhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  
  if (rhs.m_int < 1) {
    if (rhs.m_int == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lhs;
    uVar3 = SUB168(auVar2 / ZEXT416((uint)-rhs.m_int),0);
    if (uVar3 < 0x80000000) {
      iVar4 = -SUB164(auVar2 / ZEXT416((uint)-rhs.m_int),0);
    }
    else {
      iVar4 = -0x80000000;
      if (uVar3 != 0x80000000) goto LAB_0011afc6;
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = lhs;
    iVar4 = SUB164(auVar1 / ZEXT416((uint)rhs.m_int),0);
    if ((auVar1 / ZEXT416((uint)rhs.m_int) & (undefined1  [16])0xffffffff80000000) !=
        (undefined1  [16])0x0) {
LAB_0011afc6:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  result->m_int = iVar4;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }